

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void operator_bool_suite::test_boolean(void)

{
  undefined1 local_89;
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_57 [2];
  undefined1 local_55 [13];
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_48,false);
  local_a[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_48);
  local_55[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(false))","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20d7,"void operator_bool_suite::test_boolean()",local_a,local_55);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_88,true);
  local_57[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_88);
  local_89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(true))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20d8,"void operator_bool_suite::test_boolean()",local_57,&local_89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  return;
}

Assistant:

void test_boolean()
{
    TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(false)), false);
    TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(true)), true);
}